

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldChangeType
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  bool bVar1;
  Which WVar2;
  int iVar3;
  uint64_t uVar4;
  double dVar5;
  ArrayPtr<const_char> local_370;
  Fault local_360;
  Fault f_1;
  ArrayPtr<const_char> local_348;
  ArrayPtr<const_char> local_338;
  StringPtr local_328;
  ArrayPtr<const_char> local_318;
  StringPtr local_308;
  ArrayPtr<const_char> local_2f8;
  StringPtr local_2e8;
  Reader local_2d8;
  undefined1 local_2a8 [8];
  Reader nameText;
  Builder name;
  Fault local_260;
  Fault f;
  undefined1 local_230 [8];
  Builder dval;
  ArrayPtr<const_char> local_1f8;
  ArrayPtr<const_char> local_1e8;
  StringPtr local_1d8;
  Reader local_1c8;
  ArrayPtr<const_char> local_198;
  undefined1 local_188 [8];
  Builder typeName;
  Builder local_138;
  Builder local_110;
  Builder local_e8;
  Builder local_c0;
  undefined1 local_98 [8];
  Builder type;
  undefined1 local_48 [8];
  Builder field;
  bool scopeHasUnion_local;
  uint *nextOrdinal_local;
  
  field._builder._39_1_ = scopeHasUnion;
  Declaration::Builder::getField((Builder *)local_48,&decl);
  Declaration::Field::Builder::getDefaultValue
            ((Builder *)&type._builder.dataSize,(Builder *)local_48);
  bVar1 = Declaration::Field::DefaultValue::Builder::isNone((Builder *)&type._builder.dataSize);
  if (bVar1) {
    Declaration::Field::Builder::getType((Builder *)local_98,(Builder *)local_48);
    while (bVar1 = Expression::Builder::isApplication((Builder *)local_98), bVar1) {
      iVar3 = rand();
      if (iVar3 % 2 == 0) {
        Expression::Builder::initRelativeName
                  ((Builder *)&typeName._builder.dataSize,(Builder *)local_98);
      }
      else {
        Expression::Builder::getApplication(&local_138,(Builder *)local_98);
        Expression::Application::Builder::getParams(&local_110,&local_138);
        List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Builder::operator[]
                  (&local_e8,&local_110,0);
        Expression::Param::Builder::getValue(&local_c0,&local_e8);
        memcpy(local_98,&local_c0,0x28);
      }
    }
    Expression::Builder::getRelativeName((Builder *)local_188,(Builder *)local_98);
    LocatedText::Builder::asReader(&local_1c8,(Builder *)local_188);
    local_198 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_1c8);
    kj::StringPtr::StringPtr(&local_1d8,"Text");
    bVar1 = kj::StringPtr::startsWith((StringPtr *)&local_198,&local_1d8);
    if (bVar1) {
      Text::Reader::Reader((Reader *)&local_1e8,"Int32");
      LocatedText::Builder::setValue((Builder *)local_188,(Reader)local_1e8);
    }
    else {
      Text::Reader::Reader((Reader *)&local_1f8,"Text");
      LocatedText::Builder::setValue((Builder *)local_188,(Reader)local_1f8);
    }
    kj::StringPtr::StringPtr((StringPtr *)&dval._builder.dataSize,"Change the type of a field.");
    ChangeInfo::ChangeInfo(__return_storage_ptr__,INCOMPATIBLE,(StringPtr)stack0xfffffffffffffdf8);
  }
  else {
    Declaration::Field::Builder::getDefaultValue((Builder *)&f,(Builder *)local_48);
    Declaration::Field::DefaultValue::Builder::getValue((Builder *)local_230,(Builder *)&f);
    WVar2 = Expression::Builder::which((Builder *)local_230);
    switch(WVar2) {
    case UNKNOWN:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x19a,FAILED,(char *)0x0,"\"unknown value expression?\"",
                 (char (*) [26])"unknown value expression?");
      kj::_::Debug::Fault::fatal(&local_260);
    case POSITIVE_INT:
      uVar4 = Expression::Builder::getPositiveInt((Builder *)local_230);
      Expression::Builder::setPositiveInt((Builder *)local_230,uVar4 ^ 1);
      break;
    case NEGATIVE_INT:
      uVar4 = Expression::Builder::getNegativeInt((Builder *)local_230);
      Expression::Builder::setNegativeInt((Builder *)local_230,uVar4 ^ 1);
      break;
    case FLOAT:
      dVar5 = Expression::Builder::getFloat((Builder *)local_230);
      Expression::Builder::setFloat((Builder *)local_230,-dVar5);
      break;
    case STRING:
    case LIST:
    case TUPLE:
    case BINARY:
      kj::StringPtr::StringPtr
                ((StringPtr *)&f_1,"Change the default value of a field, but it\'s a pointer field."
                );
      ChangeInfo::ChangeInfo(__return_storage_ptr__,NO_CHANGE,(StringPtr)_f_1);
      return __return_storage_ptr__;
    case RELATIVE_NAME:
      Expression::Builder::getRelativeName
                ((Builder *)&nameText.super_StringPtr.content.size_,(Builder *)local_230);
      LocatedText::Builder::asReader(&local_2d8,(Builder *)&nameText.super_StringPtr.content.size_);
      _local_2a8 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_2d8);
      kj::StringPtr::StringPtr(&local_2e8,"true");
      bVar1 = kj::StringPtr::operator==((StringPtr *)local_2a8,&local_2e8);
      if (bVar1) {
        Text::Reader::Reader((Reader *)&local_2f8,"false");
        LocatedText::Builder::setValue
                  ((Builder *)&nameText.super_StringPtr.content.size_,(Reader)local_2f8);
      }
      else {
        kj::StringPtr::StringPtr(&local_308,"false");
        bVar1 = kj::StringPtr::operator==((StringPtr *)local_2a8,&local_308);
        if (bVar1) {
          Text::Reader::Reader((Reader *)&local_318,"true");
          LocatedText::Builder::setValue
                    ((Builder *)&nameText.super_StringPtr.content.size_,(Reader)local_318);
        }
        else {
          kj::StringPtr::StringPtr(&local_328,"foo");
          bVar1 = kj::StringPtr::operator==((StringPtr *)local_2a8,&local_328);
          if (bVar1) {
            Text::Reader::Reader((Reader *)&local_338,"bar");
            LocatedText::Builder::setValue
                      ((Builder *)&nameText.super_StringPtr.content.size_,(Reader)local_338);
          }
          else {
            Text::Reader::Reader((Reader *)&local_348,"foo");
            LocatedText::Builder::setValue
                      ((Builder *)&nameText.super_StringPtr.content.size_,(Reader)local_348);
          }
        }
      }
      break;
    case APPLICATION:
    case MEMBER:
    case ABSOLUTE_NAME:
    case IMPORT:
    case EMBED:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
                (&local_360,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x1b7,FAILED,(char *)0x0,"\"Unexpected expression type.\"",
                 (char (*) [28])"Unexpected expression type.");
      kj::_::Debug::Fault::fatal(&local_360);
    }
    kj::StringPtr::StringPtr
              ((StringPtr *)&local_370,"Change the default value of a pritimive field.");
    ChangeInfo::ChangeInfo(__return_storage_ptr__,INCOMPATIBLE,(StringPtr)local_370);
  }
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldChangeType(Declaration::Builder decl, uint& nextOrdinal,
                                  bool scopeHasUnion) {
  auto field = decl.getField();

  if (field.getDefaultValue().isNone()) {
    // Change the type.
    auto type = field.getType();
    while (type.isApplication()) {
      // Either change the list parameter, or revert to a non-list.
      if (rand() % 2) {
        type = type.getApplication().getParams()[0].getValue();
      } else {
        type.initRelativeName();
      }
    }
    auto typeName = type.getRelativeName();
    if (typeName.asReader().getValue().startsWith("Text")) {
      typeName.setValue("Int32");
    } else {
      typeName.setValue("Text");
    }
    return { INCOMPATIBLE, "Change the type of a field." };
  } else {
    // Change the default value.
    auto dval = field.getDefaultValue().getValue();
    switch (dval.which()) {
      case Expression::UNKNOWN: KJ_FAIL_ASSERT("unknown value expression?");
      case Expression::POSITIVE_INT: dval.setPositiveInt(dval.getPositiveInt() ^ 1); break;
      case Expression::NEGATIVE_INT: dval.setNegativeInt(dval.getNegativeInt() ^ 1); break;
      case Expression::FLOAT: dval.setFloat(-dval.getFloat()); break;
      case Expression::RELATIVE_NAME: {
        auto name = dval.getRelativeName();
        auto nameText = name.asReader().getValue();
        if (nameText == "true") {
          name.setValue("false");
        } else if (nameText == "false") {
          name.setValue("true");
        } else if (nameText == "foo") {
          name.setValue("bar");
        } else {
          name.setValue("foo");
        }
        break;
      }
      case Expression::STRING:
      case Expression::BINARY:
      case Expression::LIST:
      case Expression::TUPLE:
        return { NO_CHANGE, "Change the default value of a field, but it's a pointer field." };

      case Expression::ABSOLUTE_NAME:
      case Expression::IMPORT:
      case Expression::EMBED:
      case Expression::APPLICATION:
      case Expression::MEMBER:
        KJ_FAIL_ASSERT("Unexpected expression type.");
    }
    return { INCOMPATIBLE, "Change the default value of a pritimive field." };
  }
}